

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

InternalParseResult * __thiscall
Catch::clara::detail::Opt::parse
          (InternalParseResult *__return_storage_ptr__,Opt *this,string *param_1,TokenStream *tokens
          )

{
  string *optToken;
  vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *pvVar1;
  element_type *peVar2;
  bool bVar3;
  int iVar4;
  TokenStream *pTVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  ParserResult result;
  TokenStream remainingTokens;
  Result validationResult;
  undefined1 local_138 [24];
  undefined1 local_120 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> local_f8;
  Token local_d8;
  Token local_b0;
  BasicResult<void> local_88;
  ParseState local_58;
  
  (*(this->super_ParserRefImpl<Catch::clara::detail::Opt>).
    super_ComposableParserImpl<Catch::clara::detail::Opt>.super_ParserBase._vptr_ParserBase[2])
            (&local_88);
  if (local_88.super_ResultValueBase<void>.super_ResultBase.m_type != Ok) {
    BasicResult<Catch::clara::detail::ParseState>::BasicResult<void>
              (__return_storage_ptr__,&local_88);
    goto LAB_00145857;
  }
  local_108._M_allocated_capacity = (size_type)(tokens->it)._M_current;
  local_108._8_8_ = (tokens->itEnd)._M_current;
  std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::vector
            (&local_f8,&tokens->m_tokenBuffer);
  if ((local_f8.
       super__Vector_base<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       local_f8.
       super__Vector_base<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>
       ._M_impl.super__Vector_impl_data._M_finish) &&
     (local_108._M_allocated_capacity == local_108._8_8_)) {
LAB_001457d4:
    local_138._0_4_ = 1;
    local_138._8_8_ = local_108._M_allocated_capacity;
    local_138._16_8_ = local_108._8_8_;
    std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::vector
              ((vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *)
               local_120,&local_f8);
    (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).
    super_ResultBase.m_type = Ok;
    (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).
    super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__ResultValueBase_00241980;
    (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).field_0.
    m_value.m_type = local_138._0_4_;
    (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).field_0.
    m_value.m_remainingTokens.it._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138._8_8_;
    (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).field_0.
    m_value.m_remainingTokens.itEnd._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138._16_8_;
    std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::vector
              (&(__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).
                field_0.m_value.m_remainingTokens.m_tokenBuffer,
               (vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *)
               local_120);
    (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).
    super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__BasicResult_00241928;
    (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
    (__return_storage_ptr__->m_errorMessage)._M_string_length = 0;
    (__return_storage_ptr__->m_errorMessage).field_2._M_local_buf[0] = '\0';
    std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::~vector
              ((vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *)
               local_120);
  }
  else {
    if (local_f8.
        super__Vector_base<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_f8.
        super__Vector_base<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      __assert_fail("!m_tokenBuffer.empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/titapo[P]ezy/build_O1/_deps/catch2-src/single_include/catch2/catch.hpp"
                    ,0x22d2,"const Token *Catch::clara::detail::TokenStream::operator->() const");
    }
    if ((local_f8.
         super__Vector_base<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>
         ._M_impl.super__Vector_impl_data._M_start)->type != Option) goto LAB_001457d4;
    TokenStream::operator*(&local_b0,(TokenStream *)&local_108);
    optToken = &local_b0.token;
    bVar3 = isMatch(this,optToken);
    if (!bVar3) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0.token._M_dataplus._M_p != &local_b0.token.field_2) {
        operator_delete(local_b0.token._M_dataplus._M_p,
                        local_b0.token.field_2._M_allocated_capacity + 1);
      }
      goto LAB_001457d4;
    }
    iVar4 = (*((this->super_ParserRefImpl<Catch::clara::detail::Opt>).m_ref.
               super___shared_ptr<Catch::clara::detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              )->_vptr_BoundRef[3])();
    peVar2 = (this->super_ParserRefImpl<Catch::clara::detail::Opt>).m_ref.
             super___shared_ptr<Catch::clara::detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((char)iVar4 == '\0') {
      TokenStream::operator++((TokenStream *)&local_108);
      if ((local_f8.
           super__Vector_base<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>
           ._M_impl.super__Vector_impl_data._M_start ==
           local_f8.
           super__Vector_base<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>
           ._M_impl.super__Vector_impl_data._M_finish) &&
         (local_108._M_allocated_capacity == local_108._8_8_)) {
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_138,"Expected argument following ",optToken);
        BasicResult<Catch::clara::detail::ParseState>::BasicResult
                  (__return_storage_ptr__,RuntimeError,(string *)local_138);
        local_d8.token.field_2._M_allocated_capacity = local_138._16_8_;
        local_d8.token._M_dataplus._M_p = (pointer)local_138._0_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._0_8_ ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_138 + 0x10)) goto LAB_00145b95;
      }
      else {
        TokenStream::operator*(&local_d8,(TokenStream *)&local_108);
        if (local_d8.type == Argument) {
          (*peVar2->_vptr_BoundRef[4])(local_138,peVar2,&local_d8.token);
          if (local_138._8_4_ == Ok) {
            (*(code *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(local_138._0_8_ + 0x10))->_M_allocated_capacity)();
            if (local_138._12_4_ != 2) {
              local_138._0_8_ = &PTR__BasicResult_00241a88;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_138._16_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_120 + 8)) {
                operator_delete((void *)local_138._16_8_,(ulong)(local_120._8_8_ + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d8.token._M_dataplus._M_p != &local_d8.token.field_2) goto LAB_00145aac;
              goto LAB_00145ab4;
            }
            (*(code *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(local_138._0_8_ + 0x10))->_M_allocated_capacity)();
            pvVar1 = &local_58.m_remainingTokens.m_tokenBuffer;
            local_58.m_type = local_138._12_4_;
            local_58.m_remainingTokens.it._M_current =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_108._M_allocated_capacity;
            local_58.m_remainingTokens.itEnd._M_current =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_108._8_8_;
            std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
            vector(pvVar1,&local_f8);
            BasicResult<Catch::clara::detail::ParseState>::ok<Catch::clara::detail::ParseState>
                      (__return_storage_ptr__,&local_58);
            std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
            ~vector(pvVar1);
          }
          else {
            BasicResult<Catch::clara::detail::ParseState>::
            BasicResult<Catch::clara::detail::ParseResultType>
                      (__return_storage_ptr__,
                       (BasicResult<Catch::clara::detail::ParseResultType> *)local_138);
          }
          local_138._0_8_ = &PTR__BasicResult_00241a88;
          paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_138._16_8_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._16_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_120 + 8)) {
LAB_00145b72:
            operator_delete(paVar6,(ulong)(local_120._8_8_ + 1));
          }
        }
        else {
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_138,"Expected argument following ",optToken);
          BasicResult<Catch::clara::detail::ParseState>::BasicResult
                    (__return_storage_ptr__,RuntimeError,(string *)local_138);
          local_120._8_8_ = local_138._16_8_;
          paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_138._0_8_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_138 + 0x10)) goto LAB_00145b72;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8.token._M_dataplus._M_p == &local_d8.token.field_2) goto LAB_00145b95;
      }
LAB_00145b8d:
      operator_delete(local_d8.token._M_dataplus._M_p,
                      (ulong)(local_d8.token.field_2._M_allocated_capacity + 1));
    }
    else {
      (*peVar2->_vptr_BoundRef[4])(local_138,peVar2,1);
      if (local_138._8_4_ == Ok) {
        (*(code *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(local_138._0_8_ + 0x10))->_M_allocated_capacity)();
        if (local_138._12_4_ == 2) {
          (*(code *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(local_138._0_8_ + 0x10))->_M_allocated_capacity)();
          pvVar1 = &local_58.m_remainingTokens.m_tokenBuffer;
          local_58.m_type = local_138._12_4_;
          local_58.m_remainingTokens.it._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               local_108._M_allocated_capacity;
          local_58.m_remainingTokens.itEnd._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108._8_8_;
          std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
          vector(pvVar1,&local_f8);
          BasicResult<Catch::clara::detail::ParseState>::ok<Catch::clara::detail::ParseState>
                    (__return_storage_ptr__,&local_58);
          std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
          ~vector(pvVar1);
          goto LAB_00145a29;
        }
        local_138._0_8_ = &PTR__BasicResult_00241a88;
        local_d8.token.field_2._M_allocated_capacity = local_120._8_8_;
        local_d8.token._M_dataplus._M_p = (pointer)local_138._16_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._16_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_120 + 8)) {
LAB_00145aac:
          operator_delete(local_d8.token._M_dataplus._M_p,
                          (ulong)(local_d8.token.field_2._M_allocated_capacity + 1));
        }
LAB_00145ab4:
        pTVar5 = TokenStream::operator++((TokenStream *)&local_108);
        local_138._0_8_ = local_138._0_8_ & 0xffffffff00000000;
        local_138._8_8_ = (pTVar5->it)._M_current;
        local_138._16_8_ = (pTVar5->itEnd)._M_current;
        std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
        vector((vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *)
               local_120,&pTVar5->m_tokenBuffer);
        BasicResult<Catch::clara::detail::ParseState>::ok<Catch::clara::detail::ParseState>
                  (__return_storage_ptr__,(ParseState *)local_138);
        std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
        ~vector((vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *
                )local_120);
      }
      else {
        BasicResult<Catch::clara::detail::ParseState>::
        BasicResult<Catch::clara::detail::ParseResultType>
                  (__return_storage_ptr__,
                   (BasicResult<Catch::clara::detail::ParseResultType> *)local_138);
LAB_00145a29:
        local_138._0_8_ = &PTR__BasicResult_00241a88;
        local_d8.token.field_2._M_allocated_capacity = local_120._8_8_;
        local_d8.token._M_dataplus._M_p = (pointer)local_138._16_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._16_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_120 + 8)) goto LAB_00145b8d;
      }
    }
LAB_00145b95:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.token._M_dataplus._M_p != &local_b0.token.field_2) {
      operator_delete(local_b0.token._M_dataplus._M_p,
                      local_b0.token.field_2._M_allocated_capacity + 1);
    }
    if (!bVar3) goto LAB_001457d4;
  }
  std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::~vector
            (&local_f8);
LAB_00145857:
  local_88.super_ResultValueBase<void>.super_ResultBase._vptr_ResultBase =
       (_func_int **)&PTR__BasicResult_00241898;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.m_errorMessage._M_dataplus._M_p != &local_88.m_errorMessage.field_2) {
    operator_delete(local_88.m_errorMessage._M_dataplus._M_p,
                    local_88.m_errorMessage.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

auto parse( std::string const&, TokenStream const &tokens ) const -> InternalParseResult override {
            auto validationResult = validate();
            if( !validationResult )
                return InternalParseResult( validationResult );

            auto remainingTokens = tokens;
            if( remainingTokens && remainingTokens->type == TokenType::Option ) {
                auto const &token = *remainingTokens;
                if( isMatch(token.token ) ) {
                    if( m_ref->isFlag() ) {
                        auto flagRef = static_cast<detail::BoundFlagRefBase*>( m_ref.get() );
                        auto result = flagRef->setFlag( true );
                        if( !result )
                            return InternalParseResult( result );
                        if( result.value() == ParseResultType::ShortCircuitAll )
                            return InternalParseResult::ok( ParseState( result.value(), remainingTokens ) );
                    } else {
                        auto valueRef = static_cast<detail::BoundValueRefBase*>( m_ref.get() );
                        ++remainingTokens;
                        if( !remainingTokens )
                            return InternalParseResult::runtimeError( "Expected argument following " + token.token );
                        auto const &argToken = *remainingTokens;
                        if( argToken.type != TokenType::Argument )
                            return InternalParseResult::runtimeError( "Expected argument following " + token.token );
                        auto result = valueRef->setValue( argToken.token );
                        if( !result )
                            return InternalParseResult( result );
                        if( result.value() == ParseResultType::ShortCircuitAll )
                            return InternalParseResult::ok( ParseState( result.value(), remainingTokens ) );
                    }
                    return InternalParseResult::ok( ParseState( ParseResultType::Matched, ++remainingTokens ) );
                }
            }
            return InternalParseResult::ok( ParseState( ParseResultType::NoMatch, remainingTokens ) );
        }